

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVH.cpp
# Opt level: O3

void __thiscall
SimpleBVH::BVH::nearest_facet_recursive
          (BVH *this,VectorMax3d *p,int *nearest_f,VectorMax3d *nearest_point,double *sq_dist,int n,
          int b,int e)

{
  pointer paVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  Index size;
  int n_00;
  int b_00;
  long lVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double local_80;
  double cur_sq_dist;
  VectorMax3d cur_nearest_point;
  
  if (e - b == 0 || e < b) {
    __assert_fail("e > b",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/geometryprocessing[P]SimpleBVH/src/SimpleBVH/BVH.cpp"
                  ,0x1a8,
                  "void SimpleBVH::BVH::nearest_facet_recursive(const VectorMax3d &, int &, VectorMax3d &, double &, int, int, int) const"
                 );
  }
  if (b + 1 == e) {
    cur_nearest_point.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_data
    .array[2] = 0.0;
    leaf_callback(this,p,(this->new2old).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[b],(VectorMax3d *)&cur_sq_dist,&local_80);
    dVar9 = cur_nearest_point.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
            m_storage.m_data.array[2];
    if (local_80 < *sq_dist) {
      *nearest_f = b;
      if ((double)(nearest_point->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).
                  m_storage.m_rows !=
          cur_nearest_point.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
          m_data.array[2]) {
        if (3 < (ulong)cur_nearest_point.
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                       m_data.array[2]) {
          __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                        ,
                        "/root/.cache/CPM/eigen/9cb760a6fcc3143cbb7856ce4548b1cf4b385f2e/Eigen/src/Core/PlainObjectBase.h"
                        ,0x115,
                        "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1, 0, 3, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1, 0, 3, 1>]"
                       );
        }
        (nearest_point->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.
        m_rows = (Index)cur_nearest_point.
                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                        m_data.array[2];
      }
      dVar7 = (double)(ulong)((uint)((ulong)nearest_point >> 3) & 1);
      if ((long)cur_nearest_point.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                m_storage.m_data.array[2] <= (long)dVar7) {
        dVar7 = cur_nearest_point.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                m_storage.m_data.array[2];
      }
      lVar6 = (long)cur_nearest_point.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                    m_storage.m_data.array[2] - (long)dVar7;
      if (0 < (long)dVar7) {
        (nearest_point->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.
        m_data.array[0] = cur_sq_dist;
      }
      lVar4 = (lVar6 - (lVar6 >> 0x3f) & 0xfffffffffffffffeU) + (long)dVar7;
      if (1 < lVar6) {
        lVar3 = (long)dVar7 + 2U;
        if ((long)((long)dVar7 + 2U) < lVar4) {
          lVar3 = lVar4;
        }
        cur_nearest_point.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
        m_rows = lVar4;
        memcpy((nearest_point->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).
               m_storage.m_data.array + (long)dVar7,
               cur_nearest_point.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
               m_storage.m_data.array + ((long)dVar7 - 1),
               (~(ulong)dVar7 + lVar3 & 0xfffffffffffffffe) * 8 + 0x10);
        lVar4 = cur_nearest_point.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                m_storage.m_rows;
      }
      if (lVar4 < (long)dVar9) {
        memcpy((nearest_point->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).
               m_storage.m_data.array + (lVar6 / 2) * 2 + (long)dVar7,
               cur_nearest_point.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
               m_storage.m_data.array + (lVar6 / 2) * 2 + ((long)dVar7 - 1U),(lVar6 % 2) * 8);
      }
      *sq_dist = local_80;
    }
  }
  else {
    iVar2 = n * 2;
    paVar1 = (this->boxlist).
             super__Vector_base<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>,_std::allocator<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = (long)(this->boxlist).
                  super__Vector_base<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>,_std::allocator<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)paVar1 >> 6;
    if (uVar5 <= (ulong)(long)iVar2) {
      __assert_fail("childl < boxlist.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/geometryprocessing[P]SimpleBVH/src/SimpleBVH/BVH.cpp"
                    ,0x1bb,
                    "void SimpleBVH::BVH::nearest_facet_recursive(const VectorMax3d &, int &, VectorMax3d &, double &, int, int, int) const"
                   );
    }
    cur_nearest_point.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_rows
         = CONCAT44(cur_nearest_point.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                    m_storage.m_rows._4_4_,iVar2);
    n_00 = n * 2 + 1;
    if (uVar5 <= (ulong)(long)n_00) {
      __assert_fail("childr < boxlist.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/geometryprocessing[P]SimpleBVH/src/SimpleBVH/BVH.cpp"
                    ,0x1bc,
                    "void SimpleBVH::BVH::nearest_facet_recursive(const VectorMax3d &, int &, VectorMax3d &, double &, int, int, int) const"
                   );
    }
    b_00 = (e - b) / 2 + b;
    dVar7 = anon_unknown_6::point_box_signed_squared_distance(p,paVar1 + iVar2);
    dVar8 = anon_unknown_6::point_box_signed_squared_distance
                      (p,(this->boxlist).
                         super__Vector_base<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>,_std::allocator<std::array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + n_00);
    dVar9 = *sq_dist;
    if (dVar8 <= dVar7) {
      if (dVar8 < dVar9) {
        nearest_facet_recursive(this,p,nearest_f,nearest_point,sq_dist,n_00,b_00,e);
        dVar9 = *sq_dist;
      }
      if (dVar9 <= dVar7) {
        return;
      }
      n_00 = (int)cur_nearest_point.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                  m_storage.m_rows;
      e = b_00;
    }
    else {
      if (dVar7 < dVar9) {
        nearest_facet_recursive
                  (this,p,nearest_f,nearest_point,sq_dist,
                   (int)cur_nearest_point.
                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                        m_rows,b,b_00);
        dVar9 = *sq_dist;
      }
      b = b_00;
      if (dVar9 <= dVar8) {
        return;
      }
    }
    nearest_facet_recursive(this,p,nearest_f,nearest_point,sq_dist,n_00,b,e);
  }
  return;
}

Assistant:

void BVH::nearest_facet_recursive(
    const VectorMax3d& p,
    int& nearest_f,
    VectorMax3d& nearest_point,
    double& sq_dist,
    int n,
    int b,
    int e) const
{
    assert(e > b);

    // If node is a leaf: compute point-facet distance
    // and replace current if nearer
    if (b + 1 == e) {
        VectorMax3d cur_nearest_point;
        double cur_sq_dist;
        leaf_callback(p, new2old[b], cur_nearest_point, cur_sq_dist);
        if (cur_sq_dist < sq_dist) {
            nearest_f = b;
            nearest_point = cur_nearest_point;
            sq_dist = cur_sq_dist;
        }
        return;
    }
    int m = b + (e - b) / 2;
    int childl = 2 * n;
    int childr = 2 * n + 1;

    assert(childl < boxlist.size());
    assert(childr < boxlist.size());

    double dl = point_box_signed_squared_distance(p, boxlist[childl]);
    double dr = point_box_signed_squared_distance(p, boxlist[childr]);

    // Traverse the "nearest" child first, so that it has more chances
    // to prune the traversal of the other child.
    if (dl < dr) {
        if (dl < sq_dist) {
            nearest_facet_recursive(
                p, nearest_f, nearest_point, sq_dist, childl, b, m);
        }
        if (dr < sq_dist) {
            nearest_facet_recursive(
                p, nearest_f, nearest_point, sq_dist, childr, m, e);
        }
    } else {
        if (dr < sq_dist) {
            nearest_facet_recursive(
                p, nearest_f, nearest_point, sq_dist, childr, m, e);
        }
        if (dl < sq_dist) {
            nearest_facet_recursive(
                p, nearest_f, nearest_point, sq_dist, childl, b, m);
        }
    }
}